

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void computeHMS(DateTime *p)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  
  if (p->validHMS != '\0') {
    return;
  }
  computeJD(p);
  iVar2 = (int)((p->iJD + 43200000) / 86400000) * -86400000 + (int)p->iJD + 43200000;
  p->s = (double)(iVar2 % 60000) / 1000.0;
  sVar1 = (short)(iVar2 / 60000);
  uVar3 = ((uint)(sVar1 * -0x7777) >> 0x10) + iVar2 / 60000;
  p->m = (int)(short)(sVar1 + (((short)uVar3 >> 5) + (short)((uVar3 & 0xffff) >> 0xf)) * -0x3c);
  p->h = iVar2 / 3600000;
  p->field_0x2c = p->field_0x2c & 0xfe;
  p->validHMS = '\x01';
  return;
}

Assistant:

static void computeHMS(DateTime *p){
  int day_ms, day_min; /* milliseconds, minutes into the day */
  if( p->validHMS ) return;
  computeJD(p);
  day_ms = (int)((p->iJD + 43200000) % 86400000);
  p->s = (day_ms % 60000)/1000.0;
  day_min = day_ms/60000;
  p->m = day_min % 60;
  p->h = day_min / 60;
  p->rawS = 0;
  p->validHMS = 1;
}